

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O2

bool LEARNER::example_is_newline_not_header(example *ec)

{
  wclass *pwVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = example_is_newline(ec);
  if (iVar3 == 0) {
    bVar2 = false;
  }
  else {
    pwVar1 = (ec->l).cs.costs._begin;
    bVar2 = true;
    if ((long)(ec->l).cs.costs._end - (long)pwVar1 == 0x10) {
      bVar2 = (bool)(-(pwVar1->partial_prediction != -1.0) & 1);
    }
  }
  return bVar2;
}

Assistant:

inline bool example_is_newline_not_header(example& ec) { return (example_is_newline(ec) && !ec_is_example_header(ec)); }